

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O2

void __thiscall QWizardHeader::paintEvent(QWizardHeader *this,QPaintEvent *param_1)

{
  int y1;
  QWidgetData *pQVar1;
  QPalette *this_00;
  int x;
  int y1_00;
  long in_FS_OFFSET;
  QStylePainter local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.wstyle = (QStyle *)&DAT_aaaaaaaaaaaaaaaa;
  local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_58.widget = (QWidget *)&DAT_aaaaaaaaaaaaaaaa;
  QStylePainter::QStylePainter(&local_58,&this->super_QWidget);
  QPainter::drawPixmap(&local_58.super_QPainter,0,0,&this->bannerPixmap);
  pQVar1 = (this->super_QWidget).data;
  x = (pQVar1->crect).x2.m_i - (pQVar1->crect).x1.m_i;
  y1_00 = (pQVar1->crect).y2.m_i - (pQVar1->crect).y1.m_i;
  y1 = y1_00 + -1;
  this_00 = QWidget::palette(&this->super_QWidget);
  QPalette::mid(this_00);
  QPainter::setPen((QColor *)&local_58);
  QPainter::drawLine(&local_58.super_QPainter,0,y1,x + -1,y1);
  QPalette::base(this_00);
  QPainter::setPen((QColor *)&local_58);
  QPainter::drawPoint(&local_58.super_QPainter,x,y1);
  QPainter::drawLine(&local_58.super_QPainter,0,y1_00,x,y1_00);
  QPainter::~QPainter(&local_58.super_QPainter);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWizardHeader::paintEvent(QPaintEvent * /* event */)
{
    QStylePainter painter(this);
    painter.drawPixmap(0, 0, bannerPixmap);

    int x = width() - 2;
    int y = height() - 2;
    const QPalette &pal = palette();
    painter.setPen(pal.mid().color());
    painter.drawLine(0, y, x, y);
    painter.setPen(pal.base().color());
    painter.drawPoint(x + 1, y);
    painter.drawLine(0, y + 1, x + 1, y + 1);
}